

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O0

void TTD::NSSnapObjects::EmitAddtlInfo_SnapGeneratorInfo(SnapObject *snpObject,FileWriter *writer)

{
  SnapGeneratorInfo *pSVar1;
  uint local_28;
  uint local_24;
  uint32 i_1;
  RegSlot i;
  SnapGeneratorInfo *sgi;
  FileWriter *writer_local;
  SnapObject *snpObject_local;
  
  pSVar1 = SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapGeneratorInfo*,(TTD::NSSnapObjects::SnapObjectType)37>
                     (snpObject);
  FileWriter::WriteInt32(writer,i32Val,pSVar1->generatorPrototype,CommaSeparator);
  FileWriter::WriteInt32(writer,i32Val,pSVar1->frame_slotCount,CommaSeparator);
  (*writer->_vptr_FileWriter[3])(writer,0x72,3);
  (*writer->_vptr_FileWriter[4])(writer,0);
  for (local_24 = 0; local_24 < pSVar1->frame_slotCount; local_24 = local_24 + 1) {
    NSSnapValues::EmitTTDVar(pSVar1->frame_slotArray[local_24],writer,local_24 != 0);
  }
  (*writer->_vptr_FileWriter[5])(writer,0);
  FileWriter::WriteUInt32(writer,u32Val,pSVar1->state,CommaSeparator);
  FileWriter::WriteAddr(writer,objectId,pSVar1->scriptFunction,CommaSeparator);
  FileWriter::WriteUInt32(writer,u32Val,pSVar1->arguments_callInfo_count,CommaSeparator);
  FileWriter::WriteUInt32(writer,u32Val,(uint)pSVar1->arguments_callInfo_flags,CommaSeparator);
  FileWriter::WriteUInt32(writer,u32Val,pSVar1->arguments_count,CommaSeparator);
  (*writer->_vptr_FileWriter[3])(writer,0x73,3);
  (*writer->_vptr_FileWriter[4])(writer,0);
  for (local_28 = 0; local_28 < pSVar1->arguments_count; local_28 = local_28 + 1) {
    NSSnapValues::EmitTTDVar(pSVar1->arguments_values[local_28],writer,local_28 != 0);
  }
  (*writer->_vptr_FileWriter[5])(writer,0);
  FileWriter::WriteUInt32(writer,u32Val,pSVar1->byteCodeReader_offset,CommaSeparator);
  return;
}

Assistant:

void EmitAddtlInfo_SnapGeneratorInfo(const SnapObject* snpObject, FileWriter* writer)
        {
            SnapGeneratorInfo* sgi = SnapObjectGetAddtlInfoAs<SnapGeneratorInfo*, SnapObjectType::SnapGenerator>(snpObject);

            writer->WriteInt32(NSTokens::Key::i32Val, sgi->generatorPrototype, NSTokens::Separator::CommaSeparator);

            writer->WriteInt32(NSTokens::Key::i32Val, sgi->frame_slotCount, NSTokens::Separator::CommaSeparator);

            // frame_slotArray
            writer->WriteKey(NSTokens::Key::frame_slotArray, NSTokens::Separator::CommaAndBigSpaceSeparator);
            writer->WriteSequenceStart();
            for(Js::RegSlot i = 0; i < sgi->frame_slotCount; ++i)
            {
                NSSnapValues::EmitTTDVar(sgi->frame_slotArray[i], writer, i != 0 ? NSTokens::Separator::CommaSeparator : NSTokens::Separator::NoSeparator);
            }
            writer->WriteSequenceEnd();

            writer->WriteUInt32(NSTokens::Key::u32Val, sgi->state, NSTokens::Separator::CommaSeparator);
            writer->WriteAddr(NSTokens::Key::objectId, sgi->scriptFunction, NSTokens::Separator::CommaSeparator);

            writer->WriteUInt32(NSTokens::Key::u32Val, sgi->arguments_callInfo_count, NSTokens::Separator::CommaSeparator);
            writer->WriteUInt32(NSTokens::Key::u32Val, sgi->arguments_callInfo_flags, NSTokens::Separator::CommaSeparator);
            writer->WriteUInt32(NSTokens::Key::u32Val, sgi->arguments_count, NSTokens::Separator::CommaSeparator);

            // arguments_values array
            writer->WriteKey(NSTokens::Key::arguments_values, NSTokens::Separator::CommaAndBigSpaceSeparator);
            writer->WriteSequenceStart();
            for(uint32 i = 0; i < sgi->arguments_count; ++i)
            {
                NSSnapValues::EmitTTDVar(sgi->arguments_values[i], writer, i != 0 ? NSTokens::Separator::CommaSeparator : NSTokens::Separator::NoSeparator);
            }
            writer->WriteSequenceEnd();

            writer->WriteUInt32(NSTokens::Key::u32Val, sgi->byteCodeReader_offset, NSTokens::Separator::CommaSeparator);
        }